

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

VP8StatusCode FinishDecoding(WebPIDecoder *idec)

{
  WebPDecoderOptions *pWVar1;
  int iVar2;
  VP8StatusCode VVar3;
  long lVar4;
  WebPDecBuffer *pWVar5;
  WebPDecBuffer *buffer;
  byte bVar6;
  
  bVar6 = 0;
  buffer = (idec->params_).output;
  pWVar1 = (idec->params_).options;
  idec->state_ = STATE_DONE;
  if (((pWVar1 != (WebPDecoderOptions *)0x0) && (pWVar1->flip != 0)) &&
     (VVar3 = WebPFlipBuffer(buffer), VVar3 != VP8_STATUS_OK)) {
    return VVar3;
  }
  if (idec->final_output_ != (WebPDecBuffer *)0x0) {
    WebPCopyDecBufferPixels(buffer,idec->final_output_);
    WebPFreeDecBuffer(&idec->output_);
    pWVar5 = idec->final_output_;
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      iVar2 = pWVar5->width;
      buffer->colorspace = pWVar5->colorspace;
      buffer->width = iVar2;
      pWVar5 = (WebPDecBuffer *)((long)pWVar5 + (ulong)bVar6 * -0x10 + 8);
      buffer = (WebPDecBuffer *)((long)buffer + (ulong)bVar6 * -0x10 + 8);
    }
    idec->final_output_ = (WebPDecBuffer *)0x0;
  }
  return VP8_STATUS_OK;
}

Assistant:

static VP8StatusCode FinishDecoding(WebPIDecoder* const idec) {
  const WebPDecoderOptions* const options = idec->params_.options;
  WebPDecBuffer* const output = idec->params_.output;

  idec->state_ = STATE_DONE;
  if (options != NULL && options->flip) {
    const VP8StatusCode status = WebPFlipBuffer(output);
    if (status != VP8_STATUS_OK) return status;
  }
  if (idec->final_output_ != NULL) {
    WebPCopyDecBufferPixels(output, idec->final_output_);  // do the slow-copy
    WebPFreeDecBuffer(&idec->output_);
    *output = *idec->final_output_;
    idec->final_output_ = NULL;
  }
  return VP8_STATUS_OK;
}